

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O1

bool __thiscall nite::Color::cInterp(Color *this,Color *f,float Step)

{
  float fVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar1 = this->r;
  fVar3 = f->r;
  if ((((fVar1 != fVar3) || (NAN(fVar1) || NAN(fVar3))) || (this->g != f->g)) ||
     (((NAN(this->g) || NAN(f->g) || (this->b != f->b)) || (NAN(this->b) || NAN(f->b))))) {
    bVar2 = false;
  }
  else {
    bVar2 = (bool)(-(f->a == this->a) & 1);
  }
  if (bVar2 == false) {
    fVar4 = 1.0;
    if (fVar3 <= 1.0) {
      fVar4 = fVar3;
    }
    fVar3 = 0.0;
    if (0.0 <= fVar4) {
      fVar3 = fVar4;
    }
    fVar4 = 1.0;
    if (f->g <= 1.0) {
      fVar4 = f->g;
    }
    fVar6 = 0.0;
    if (0.0 <= fVar4) {
      fVar6 = fVar4;
    }
    fVar4 = 1.0;
    if (f->b <= 1.0) {
      fVar4 = f->b;
    }
    fVar7 = 0.0;
    if (0.0 <= fVar4) {
      fVar7 = fVar4;
    }
    fVar4 = 1.0;
    if (f->a <= 1.0) {
      fVar4 = f->a;
    }
    fVar5 = 0.0;
    if (0.0 <= fVar4) {
      fVar5 = fVar4;
    }
    this->r = fVar1 * 100.0;
    this->g = this->g * 100.0;
    this->b = this->b * 100.0;
    this->a = this->a * 100.0;
    nite::cInterp(&this->r,fVar3 * 100.0,Step);
    nite::cInterp(&this->g,fVar6 * 100.0,Step);
    nite::cInterp(&this->b,fVar7 * 100.0,Step);
    nite::cInterp(&this->a,fVar5 * 100.0,Step);
    this->r = this->r / 100.0;
    this->g = this->g / 100.0;
    this->b = this->b / 100.0;
    this->a = this->a / 100.0;
    rectify(this);
  }
  return bVar2;
}

Assistant:

bool nite::Color::cInterp(const Color &f, float Step){
	if(*this == f) return true;
	auto copy = f;
	copy.to100();
	this->to100();
	nite::cInterp(r, copy.r, Step);
	nite::cInterp(g, copy.g, Step);
	nite::cInterp(b, copy.b, Step);
	nite::cInterp(a, copy.a, Step);
	this->to1();	
	rectify();
	return false;
}